

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O1

longdouble *
S2::GetProjection<long_double>
          (longdouble *__return_storage_ptr__,Vector3<long_double> *x,Vector3<long_double> *a_norm,
          longdouble a_norm_len,Vector3<long_double> *a0,Vector3<long_double> *a1,longdouble *error)

{
  longdouble lVar1;
  long lVar2;
  longdouble *plVar3;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble lVar5;
  Vector3<long_double> x1;
  Vector3<long_double> x0;
  longdouble local_ac;
  longdouble local_a0;
  longdouble local_94;
  longdouble local_88;
  undefined4 local_7e;
  undefined2 local_7a;
  longdouble local_78;
  undefined4 local_6e;
  undefined2 local_6a;
  longdouble local_68;
  undefined4 local_5e;
  undefined2 local_5a;
  longdouble local_58;
  undefined4 local_4e;
  undefined2 local_4a;
  longdouble local_48;
  undefined4 local_3e;
  undefined2 local_3a;
  longdouble local_38;
  undefined4 local_2e;
  undefined2 local_2a;
  longdouble local_1c;
  
  local_4a = *(undefined2 *)((long)__return_storage_ptr__ + 0xe);
  local_4e = *(undefined4 *)((long)__return_storage_ptr__ + 10);
  local_3a = *(undefined2 *)((long)__return_storage_ptr__ + 0x1e);
  local_3e = *(undefined4 *)((long)__return_storage_ptr__ + 0x1a);
  local_2a = *(undefined2 *)((long)__return_storage_ptr__ + 0x2e);
  local_2e = *(undefined4 *)((long)__return_storage_ptr__ + 0x2a);
  local_58 = *__return_storage_ptr__ - *(longdouble *)a_norm->c_;
  local_48 = __return_storage_ptr__[1] - *(longdouble *)(a_norm->c_ + 1);
  local_38 = __return_storage_ptr__[2] - *(longdouble *)(a_norm->c_ + 2);
  local_7a = *(undefined2 *)((long)__return_storage_ptr__ + 0xe);
  local_7e = *(undefined4 *)((long)__return_storage_ptr__ + 10);
  local_6a = *(undefined2 *)((long)__return_storage_ptr__ + 0x1e);
  local_6e = *(undefined4 *)((long)__return_storage_ptr__ + 0x1a);
  local_5e = *(undefined4 *)((long)__return_storage_ptr__ + 0x2a);
  local_5a = *(undefined2 *)((long)__return_storage_ptr__ + 0x2e);
  local_88 = *__return_storage_ptr__ - *(longdouble *)a0->c_;
  local_78 = __return_storage_ptr__[1] - *(longdouble *)(a0->c_ + 1);
  local_68 = __return_storage_ptr__[2] - *(longdouble *)(a0->c_ + 2);
  lVar4 = local_38 * local_38 + local_48 * local_48 + local_58 * local_58;
  lVar5 = local_68 * local_68 + local_78 * local_78 + local_88 * local_88;
  local_1c = a_norm_len;
  local_ac = local_58;
  local_a0 = local_38;
  local_94 = local_48;
  if (lVar5 <= lVar4) {
    local_ac = local_88;
    local_a0 = local_68;
    local_94 = local_78;
    if ((lVar4 == lVar5) && (!NAN(lVar4) && !NAN(lVar5))) {
      lVar2 = 0;
      do {
        if (*(longdouble *)((long)&local_58 + lVar2) != *(longdouble *)((long)&local_88 + lVar2)) {
          lVar4 = local_58;
          lVar5 = local_38;
          lVar1 = local_48;
          if (*(longdouble *)((long)&local_58 + lVar2) < *(longdouble *)((long)&local_88 + lVar2))
          goto LAB_001ef39c;
          break;
        }
        lVar2 = lVar2 + 0x10;
      } while (lVar2 != 0x30);
    }
  }
  lVar4 = local_ac;
  lVar5 = local_a0;
  lVar1 = local_94;
LAB_001ef39c:
  local_94 = lVar1;
  local_a0 = lVar5;
  local_ac = lVar4;
  plVar3 = (longdouble *)sqrtl();
  *(longdouble *)a1->c_ =
       (ABS(local_a0 * *(longdouble *)(x->c_ + 2) +
            local_94 * *(longdouble *)(x->c_ + 1) + (longdouble)0 + local_ac * *(longdouble *)x->c_)
        * (longdouble)1.5 +
       (local_1c * (longdouble)6.964101615137754 + (longdouble)6.153480596427404e-15) * in_ST0) *
       (longdouble)5.421011e-20;
  return plVar3;
}

Assistant:

static T GetProjection(const Vector3<T>& x,
                       const Vector3<T>& a_norm, T a_norm_len,
                       const Vector3<T>& a0, const Vector3<T>& a1,
                       T* error) {
  // The error in the dot product is proportional to the lengths of the input
  // vectors, so rather than using "x" itself (a unit-length vector) we use
  // the vectors from "x" to the closer of the two edge endpoints.  This
  // typically reduces the error by a huge factor.
  Vector3<T> x0 = x - a0;
  Vector3<T> x1 = x - a1;
  T x0_dist2 = x0.Norm2();
  T x1_dist2 = x1.Norm2();

  // If both distances are the same, we need to be careful to choose one
  // endpoint deterministically so that the result does not change if the
  // order of the endpoints is reversed.
  T dist, result;
  if (x0_dist2 < x1_dist2 || (x0_dist2 == x1_dist2 && x0 < x1)) {
    dist = sqrt(x0_dist2);
    result = x0.DotProd(a_norm);
  } else {
    dist = sqrt(x1_dist2);
    result = x1.DotProd(a_norm);
  }
  // This calculation bounds the error from all sources: the computation of
  // the normal, the subtraction of one endpoint, and the dot product itself.
  // (DBL_ERR appears because the input points are assumed to be normalized in
  // double precision rather than in the given type T.)
  //
  // For reference, the bounds that went into this calculation are:
  // ||N'-N|| <= ((1 + 2 * sqrt(3))||N|| + 32 * sqrt(3) * DBL_ERR) * T_ERR
  // |(A.B)'-(A.B)| <= (1.5 * (A.B) + 1.5 * ||A|| * ||B||) * T_ERR
  // ||(X-Y)'-(X-Y)|| <= ||X-Y|| * T_ERR
  constexpr T T_ERR = s2pred::rounding_epsilon<T>();
  *error = (((3.5 + 2 * sqrt(3)) * a_norm_len + 32 * sqrt(3) * DBL_ERR)
            * dist + 1.5 * fabs(result)) * T_ERR;
  return result;
}